

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

PathTypeSingleSuccessorInfo *
Js::PathTypeSingleSuccessorInfo::New
          (PathTypeSuccessorKey successorKey,RecyclerWeakReference<Js::DynamicType> *typeWeakRef,
          ScriptContext *scriptContext)

{
  Recycler *pRVar1;
  PathTypeSingleSuccessorInfo *this;
  TrackAllocData local_48;
  ScriptContext *local_20;
  ScriptContext *scriptContext_local;
  RecyclerWeakReference<Js::DynamicType> *typeWeakRef_local;
  PathTypeSuccessorKey successorKey_local;
  
  local_20 = scriptContext;
  scriptContext_local = (ScriptContext *)typeWeakRef;
  typeWeakRef_local = (RecyclerWeakReference<Js::DynamicType> *)successorKey;
  pRVar1 = ScriptContext::GetRecycler(scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
             ,0x85);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  this = (PathTypeSingleSuccessorInfo *)new<Memory::Recycler>(0x18,pRVar1,0x43c4b0);
  PathTypeSingleSuccessorInfo
            (this,(PathTypeSuccessorKey)typeWeakRef_local,
             (RecyclerWeakReference<Js::DynamicType> *)scriptContext_local);
  return this;
}

Assistant:

PathTypeSingleSuccessorInfo * PathTypeSingleSuccessorInfo::New(const PathTypeSuccessorKey successorKey, RecyclerWeakReference<DynamicType> * typeWeakRef, ScriptContext * scriptContext)
    {
        return RecyclerNew(scriptContext->GetRecycler(), PathTypeSingleSuccessorInfo, successorKey, typeWeakRef);
    }